

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiplyexpression.cpp
# Opt level: O0

void __thiscall MultiplyExpression::interpret(MultiplyExpression *this,Context *context)

{
  Context *pCVar1;
  int iVar2;
  char *__nptr;
  string *this_00;
  allocator<char> local_a9;
  string local_a8 [32];
  char local_88 [8];
  char buf [64];
  string local_40 [36];
  uint local_1c;
  Context *pCStack_18;
  int num;
  Context *context_local;
  MultiplyExpression *this_local;
  
  pCStack_18 = context;
  context_local = (Context *)this;
  (*context->_vptr_Context[2])();
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(__nptr);
  std::__cxx11::string::~string(local_40);
  local_1c = iVar2 * this->_muled;
  sprintf(local_88,"%d",(ulong)local_1c);
  pCVar1 = pCStack_18;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,local_88,&local_a9);
  std::__cxx11::string::string(local_a8,this_00);
  (*pCVar1->_vptr_Context[3])(pCVar1,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return;
}

Assistant:

void MultiplyExpression::interpret(Context& context)
{
	int num = atoi(context.data().c_str());
	char buf[64];

	num *= _muled;

	sprintf(buf, "%d", num);

	context.setData(*(new string(buf)));
}